

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TempInputScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format,
               void *p_clamp_min,void *p_clamp_max)

{
  size_t __n;
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *format_00;
  ImGuiDataTypeInfo *pIVar4;
  void *p_max;
  ImGuiDataTypeTempStorage data_backup;
  char data_buf [32];
  char fmt_buf [32];
  
  format_00 = ImParseFormatTrimDecorations(format,fmt_buf,0x20);
  DataTypeFormatString(data_buf,0x20,data_type,p_data,format_00);
  ImStrTrimBlanks(data_buf);
  uVar2 = InputScalar_DefaultCharsFilter(data_type,format_00);
  bVar1 = TempInputText(bb,id,label,data_buf,0x20,uVar2 | 0x8000010);
  if (bVar1) {
    pIVar4 = DataTypeGetInfo(data_type);
    __n = pIVar4->Size;
    memcpy(&data_backup,p_data,__n);
    DataTypeApplyFromText(data_buf,data_type,p_data,format_00);
    if (p_clamp_min != (void *)0x0 || p_clamp_max != (void *)0x0) {
      p_max = p_clamp_max;
      if ((p_clamp_min != (void *)0x0 && p_clamp_max != (void *)0x0) &&
         (iVar3 = DataTypeCompare(data_type,p_clamp_min,p_clamp_max), 0 < iVar3)) {
        p_max = p_clamp_min;
        p_clamp_min = p_clamp_max;
      }
      DataTypeClamp(data_type,p_data,p_clamp_min,p_max);
    }
    iVar3 = bcmp(&data_backup,p_data,__n);
    bVar1 = iVar3 != 0;
    if (bVar1) {
      MarkItemEdited(id);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::TempInputScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format, const void* p_clamp_min, const void* p_clamp_max)
{
    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= InputScalar_DefaultCharsFilter(data_type, format);

    bool value_changed = false;
    if (TempInputText(bb, id, label, data_buf, IM_ARRAYSIZE(data_buf), flags))
    {
        // Backup old value
        size_t data_type_size = DataTypeGetInfo(data_type)->Size;
        ImGuiDataTypeTempStorage data_backup;
        memcpy(&data_backup, p_data, data_type_size);

        // Apply new value (or operations) then clamp
        DataTypeApplyFromText(data_buf, data_type, p_data, format);
        if (p_clamp_min || p_clamp_max)
        {
            if (p_clamp_min && p_clamp_max && DataTypeCompare(data_type, p_clamp_min, p_clamp_max) > 0)
                ImSwap(p_clamp_min, p_clamp_max);
            DataTypeClamp(data_type, p_data, p_clamp_min, p_clamp_max);
        }

        // Only mark as edited if new value is different
        value_changed = memcmp(&data_backup, p_data, data_type_size) != 0;
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}